

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_19::BinaryReader::ReadExceptionType(BinaryReader *this,TypeVector *sig)

{
  Result RVar1;
  ulong in_RAX;
  Enum EVar2;
  ulong uVar3;
  ulong __new_size;
  Type value_type;
  undefined8 local_38;
  Index num_values;
  
  local_38 = in_RAX;
  RVar1 = ReadCount(this,(Index *)&local_38,"exception type count");
  EVar2 = Error;
  if (RVar1.enum_ != Error) {
    __new_size = local_38 & 0xffffffff;
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::resize(sig,__new_size);
    if (__new_size != 0) {
      uVar3 = 0;
      do {
        local_38 = local_38 & 0xffffffff;
        RVar1 = ReadS32Leb128(this,(uint32_t *)((long)&local_38 + 4),"exception value type");
        if (RVar1.enum_ == Error) {
          return (Result)Error;
        }
        if ((3 < (uint)(local_38._4_4_ + ~V128)) &&
           ((local_38._4_4_ != V128 || ((this->options_->features).simd_enabled_ == false)))) {
          PrintError(this,"excepted valid exception value type (got %d)",(ulong)(uint)local_38._4_4_
                    );
          return (Result)Error;
        }
        (sig->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar3] = local_38._4_4_;
        uVar3 = uVar3 + 1;
      } while (__new_size != uVar3);
    }
    EVar2 = Ok;
  }
  return (Result)EVar2;
}

Assistant:

Result BinaryReader::ReadExceptionType(TypeVector& sig) {
  Index num_values;
  CHECK_RESULT(ReadCount(&num_values, "exception type count"));
  sig.resize(num_values);
  for (Index j = 0; j < num_values; ++j) {
    Type value_type;
    CHECK_RESULT(ReadType(&value_type, "exception value type"));
    ERROR_UNLESS(IsConcreteType(value_type),
                 "excepted valid exception value type (got %d)",
                 static_cast<int>(value_type));
    sig[j] = value_type;
  }
  return Result::Ok;
}